

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

wchar_t archive_read_format_zip_seekable_read_header(archive_read *a,archive_entry *entry)

{
  archive_rb_tree *rbt;
  archive_rb_tree *rbt_00;
  char *p;
  char cVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  zip *pzVar6;
  uLong uVar7;
  bool bVar8;
  char *pcVar9;
  int iVar10;
  wchar_t wVar11;
  uint uVar12;
  zip_entry *pzVar13;
  archive_rb_node *paVar14;
  int *piVar15;
  void *pvVar16;
  time_t tVar17;
  la_int64_t lVar18;
  Bytef *p_00;
  long lVar19;
  int *piVar20;
  Bytef *__src;
  ushort uVar21;
  char *__s;
  long lVar22;
  uchar *puVar23;
  char *pcVar24;
  archive_string *as;
  archive_rb_node *request;
  ulong n;
  int64_t iVar25;
  bool bVar26;
  archive_rb_tree *rbt_01;
  size_t min;
  archive_rb_node *paVar27;
  archive_rb_node *paVar28;
  Bytef *local_88;
  archive_string local_68;
  archive_entry *local_48;
  archive_rb_node *local_40;
  long local_38;
  
  pzVar6 = (zip *)a->format->data;
  if (pzVar6->has_encrypted_entries == -1) {
    pzVar6->has_encrypted_entries = 0;
  }
  (a->archive).archive_format = 0x50000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "ZIP";
  }
  if (pzVar6->zip_entries == (zip_entry *)0x0) {
    bVar8 = false;
    local_48 = entry;
    iVar25 = __archive_read_seek(a,pzVar6->central_directory_offset,0);
    if (iVar25 < 0) {
      return L'\xffffffe2';
    }
LAB_0035c772:
    if (!bVar8) {
      piVar20 = (int *)__archive_read_ahead(a,0x14,&local_38);
      if (piVar20 == (int *)0x0) {
        return L'\xffffffe2';
      }
      bVar26 = true;
      lVar19 = 0;
      bVar8 = false;
LAB_0035c7a4:
      lVar22 = lVar19;
      piVar15 = piVar20;
      if ((!bVar26) || (local_38 + -4 <= lVar22)) goto LAB_0035c851;
      cVar1 = *(char *)((long)piVar15 + lVar22 + 3);
      lVar19 = lVar22;
      switch(cVar1) {
      case '\x01':
      case '\x05':
        goto switchD_0035c7d3_caseD_1;
      case '\x02':
        bVar26 = false;
        piVar20 = (int *)((long)piVar15 + lVar22);
        bVar8 = true;
        if (*(int *)((long)piVar15 + lVar22) != 0x2014b50) goto switchD_0035c7d3_caseD_3;
        goto LAB_0035c7a4;
      case '\x03':
      case '\x04':
        goto switchD_0035c7d3_caseD_3;
      case '\x06':
        piVar20 = (int *)((long)piVar15 + lVar22);
        bVar26 = false;
        bVar8 = true;
        if ((*(int *)((long)piVar15 + lVar22) == 0x6054b50) ||
           (bVar26 = false, bVar8 = true, *piVar20 == 0x6064b50)) goto LAB_0035c7a4;
switchD_0035c7d3_caseD_1:
        lVar19 = lVar22 + 1;
        goto LAB_0035c840;
      default:
        goto switchD_0035c7d3_default;
      }
    }
    lVar18 = archive_filter_bytes(&a->archive,0);
    lVar19 = pzVar6->central_directory_offset;
    rbt = &pzVar6->tree;
    __archive_rb_tree_init(rbt,&rb_ops);
    rbt_00 = &pzVar6->tree_rsrc;
    __archive_rb_tree_init(rbt_00,&rb_rsrc_ops);
    pzVar6->central_directory_entries_total = 0;
    while( true ) {
      piVar20 = (int *)__archive_read_ahead(a,4,(ssize_t *)0x0);
      if (piVar20 == (int *)0x0) {
        return L'\xffffffe2';
      }
      if ((*piVar20 == 0x6064b50) || (*piVar20 == 0x6054b50)) break;
      if (*piVar20 != 0x2014b50) {
        pcVar24 = "Invalid central directory signature";
        iVar10 = -1;
        goto LAB_0035cddc;
      }
      pvVar16 = __archive_read_ahead(a,0x2e,(ssize_t *)0x0);
      if (pvVar16 == (void *)0x0) {
        return L'\xffffffe2';
      }
      pzVar13 = (zip_entry *)calloc(1,0x90);
      pzVar13->next = pzVar6->zip_entries;
      pzVar13->flags = '\x02';
      pzVar6->zip_entries = pzVar13;
      pzVar6->central_directory_entries_total = pzVar6->central_directory_entries_total + 1;
      pzVar13->system = *(uchar *)((long)pvVar16 + 5);
      uVar3 = *(ushort *)((long)pvVar16 + 8);
      pzVar13->zip_flags = uVar3;
      if ((uVar3 & 0x41) != 0) {
        pzVar6->has_encrypted_entries = 1;
      }
      pzVar13->compression = *(uchar *)((long)pvVar16 + 10);
      tVar17 = zip_time((char *)((long)pvVar16 + 0xc));
      pzVar13->mtime = tVar17;
      pzVar13->cm_zlib_crc32 = *(uint32_t *)((long)pvVar16 + 0x10);
      puVar23 = (uchar *)((long)pvVar16 + 0x13);
      if ((pzVar13->zip_flags & 8) != 0) {
        puVar23 = (uchar *)((long)pvVar16 + 0xd);
      }
      pzVar13->decdat = *puVar23;
      pzVar13->compressed_size = (ulong)*(uint *)((long)pvVar16 + 0x14);
      pzVar13->uncompressed_size = (ulong)*(uint *)((long)pvVar16 + 0x18);
      uVar3 = *(ushort *)((long)pvVar16 + 0x1c);
      n = (ulong)uVar3;
      uVar4 = *(ushort *)((long)pvVar16 + 0x1e);
      uVar5 = *(ushort *)((long)pvVar16 + 0x20);
      uVar12 = *(uint *)((long)pvVar16 + 0x26);
      pzVar13->local_header_offset = (ulong)*(uint *)((long)pvVar16 + 0x2a) + (lVar18 - lVar19);
      if (pzVar13->system == '\0') {
        uVar21 = 0x41fd;
        if ((uVar12 & 0x10) == 0) {
          uVar21 = 0x81b4;
        }
        pzVar13->mode = uVar21;
        if ((uVar12 & 1) != 0) {
          pzVar13->mode = uVar21 & 0x16d;
        }
      }
      else if (pzVar13->system == '\x03') {
        pzVar13->mode = (uint16_t)(uVar12 >> 0x10);
      }
      else {
        pzVar13->mode = 0;
      }
      __archive_read_consume(a,0x2e);
      min = uVar4 + n;
      pcVar24 = (char *)__archive_read_ahead(a,min,(ssize_t *)0x0);
      if (pcVar24 == (char *)0x0) {
        pcVar24 = "Truncated ZIP file header";
        iVar10 = 0x54;
        goto LAB_0035cddc;
      }
      p = pcVar24 + n;
      local_40 = (archive_rb_node *)(ulong)uVar5;
      wVar11 = process_extra(a,p,(ulong)uVar4,pzVar13);
      if (wVar11 != L'\0') {
        return L'\xffffffe2';
      }
      pcVar9 = pcVar24;
      if (pzVar6->process_mac_extensions == 0) {
        __archive_rb_tree_insert_node(rbt,(archive_rb_node *)pzVar13);
      }
      else {
        do {
          __s = pcVar9;
          pvVar16 = memchr(__s,0x2f,(long)p - (long)__s);
          pcVar9 = (char *)((long)pvVar16 + 1);
        } while (pvVar16 != (void *)0x0);
        if ((uVar3 < 9) || (iVar10 = strncmp("__MACOSX/",pcVar24,9), iVar10 != 0)) {
          as = &pzVar13->rsrcname;
          (pzVar13->rsrcname).length = 0;
          archive_strncat(as,"__MACOSX/",9);
          archive_strncat(as,pcVar24,(long)__s - (long)pcVar24);
          archive_strcat(as,"._");
          archive_strncat(as,__s,n - ((long)__s - (long)pcVar24));
          rbt_01 = rbt;
        }
        else {
          if ((p[-1] != '/') &&
             ((((long)__s - (long)pcVar24 < 3 || (*__s != '.')) || (__s[1] != '_')))) {
            __archive_rb_tree_insert_node(rbt,(archive_rb_node *)pzVar13);
            local_68.s = (char *)0x0;
            local_68.length = 0;
            local_68.buffer_length = 0;
            archive_strncat(&local_68,pcVar24,n);
            while (pcVar24 = strrchr(local_68.s,0x2f), pcVar24 != (char *)0x0) {
              *pcVar24 = '\0';
              paVar14 = __archive_rb_tree_find_node(rbt_00,local_68.s);
              if (paVar14 == (archive_rb_node *)0x0) break;
              __archive_rb_tree_remove_node(rbt_00,paVar14);
              archive_string_free((archive_string *)(paVar14 + 3));
              __archive_rb_tree_insert_node(rbt,paVar14);
            }
            archive_string_free(&local_68);
            goto LAB_0035cb34;
          }
          (pzVar13->rsrcname).length = 0;
          archive_strncat(&pzVar13->rsrcname,pcVar24,n);
          rbt_01 = rbt_00;
        }
        __archive_rb_tree_insert_node(rbt_01,(archive_rb_node *)pzVar13);
      }
LAB_0035cb34:
      __archive_read_consume(a,min + (long)local_40);
    }
    pzVar13 = (zip_entry *)__archive_rb_tree_iterate(rbt,(archive_rb_node *)0x0,0);
    pzVar6->entry = pzVar13;
    entry = local_48;
    goto LAB_0035c714;
  }
  if (pzVar6->entry == (zip_entry *)0x0) {
    return L'\x01';
  }
  pzVar13 = (zip_entry *)__archive_rb_tree_iterate(&pzVar6->tree,&pzVar6->entry->node,1);
  pzVar6->entry = pzVar13;
LAB_0035c714:
  if (pzVar13 == (zip_entry *)0x0) {
    return L'\x01';
  }
  pcVar24 = (pzVar13->rsrcname).s;
  if (pcVar24 == (char *)0x0) {
    paVar14 = (archive_rb_node *)0x0;
  }
  else {
    paVar14 = __archive_rb_tree_find_node(&pzVar6->tree_rsrc,pcVar24);
  }
  if (pzVar6->cctx_valid != '\0') {
    aes_ctr_release(&pzVar6->cctx);
  }
  if (pzVar6->hctx_valid != '\0') {
    __hmac_sha1_cleanup(&pzVar6->hctx);
  }
  pzVar6->hctx_valid = '\0';
  pzVar6->cctx_valid = '\0';
  pzVar6->tctx_valid = '\0';
  __archive_read_reset_passphrase(a);
  lVar18 = archive_filter_bytes(&a->archive,0);
  lVar19 = pzVar6->entry->local_header_offset;
  lVar22 = lVar19 - lVar18;
  if (lVar22 == 0 || lVar19 < lVar18) {
    if (lVar22 != 0) {
      __archive_read_seek(a,lVar19,0);
    }
  }
  else {
    __archive_read_consume(a,lVar22);
  }
  pzVar6->unconsumed = 0;
  wVar11 = zip_read_local_file_header(a,entry,pzVar6);
  if (wVar11 != L'\0') {
    return wVar11;
  }
  if (paVar14 == (archive_rb_node *)0x0) {
    return L'\0';
  }
  pzVar6 = (zip *)a->format->data;
  lVar18 = archive_filter_bytes(&a->archive,0);
  bVar2 = *(byte *)(paVar14[5].rb_nodes + 1);
  if (bVar2 == 0) {
    paVar28 = paVar14[2].rb_nodes[0];
    if (paVar28 != (archive_rb_node *)paVar14[1].rb_info) {
      pcVar24 = "Malformed OS X metadata entry: inconsistent size";
      iVar10 = 0x54;
      goto LAB_0035cddc;
    }
  }
  else {
    if (bVar2 != 8) {
      paVar27 = (archive_rb_node *)compression_name((uint)bVar2);
      pcVar24 = "Unsupported ZIP compression method (%s)";
      goto LAB_0035cd8e;
    }
    paVar28 = paVar14[2].rb_nodes[0];
  }
  if (0x400000 < (long)paVar28) {
    pcVar24 = "Mac metadata is too large: %jd > 4M bytes";
    paVar27 = paVar28;
LAB_0035cd8e:
    archive_set_error(&a->archive,0x54,pcVar24,paVar27);
    return L'\xffffffec';
  }
  paVar27 = (archive_rb_node *)paVar14[1].rb_info;
  if (0x400000 < (long)paVar27) {
    pcVar24 = "Mac metadata is too large: %jd > 4M bytes";
    goto LAB_0035cd8e;
  }
  p_00 = (Bytef *)malloc((size_t)paVar28);
  if (p_00 == (Bytef *)0x0) {
    pcVar24 = "Can\'t allocate memory for Mac metadata";
    iVar10 = 0xc;
LAB_0035cddc:
    archive_set_error(&a->archive,iVar10,pcVar24);
    return L'\xffffffe2';
  }
  paVar28 = paVar14[1].rb_nodes[1];
  lVar19 = (long)paVar28 - lVar18;
  if (lVar19 == 0 || (long)paVar28 < lVar18) {
    if (lVar19 != 0) {
      __archive_read_seek(a,(int64_t)paVar28,0);
    }
  }
  else {
    __archive_read_consume(a,lVar19);
  }
  piVar20 = (int *)__archive_read_ahead(a,0x1e,(ssize_t *)0x0);
  local_48 = entry;
  if (piVar20 == (int *)0x0) {
    pcVar24 = "Truncated ZIP file header";
    iVar10 = 0x54;
  }
  else {
    if (*piVar20 == 0x4034b50) {
      iVar25 = (ulong)*(ushort *)((long)piVar20 + 0x1a) + (ulong)*(ushort *)(piVar20 + 7) + 0x1e;
      goto LAB_0035ce62;
    }
    pcVar24 = "Damaged Zip archive";
    iVar10 = -1;
  }
  archive_set_error(&a->archive,iVar10,pcVar24);
  iVar25 = -0x14;
LAB_0035ce62:
  __archive_read_consume(a,iVar25);
  paVar28 = (archive_rb_node *)paVar14[1].rb_info;
  paVar27 = paVar14[2].rb_nodes[0];
  uVar12 = 0;
  local_88 = p_00;
  local_40 = paVar14;
  do {
    if ((uVar12 != 0) || (paVar28 == (archive_rb_node *)0x0)) {
      archive_entry_copy_mac_metadata(local_48,p_00,(long)paVar14[2].rb_nodes[0] - (long)paVar27);
      wVar11 = L'\0';
LAB_0035d026:
      __archive_read_seek(a,lVar18,0);
      pzVar6->decompress_init = '\0';
      free(p_00);
      return wVar11 >> 0x1f & wVar11;
    }
    __src = (Bytef *)__archive_read_ahead(a,1,(ssize_t *)&local_68);
    if (__src == (Bytef *)0x0) {
      archive_set_error(&a->archive,0x54,"Truncated ZIP file header");
      wVar11 = L'\xffffffec';
      goto LAB_0035d026;
    }
    if (paVar28 < local_68.s) {
      local_68.s = (char *)paVar28;
    }
    if (*(char *)(paVar14[5].rb_nodes + 1) == '\b') {
      wVar11 = zip_deflate_init(a,pzVar6);
      if (wVar11 != L'\0') goto LAB_0035d026;
      (pzVar6->stream).next_in = __src;
      (pzVar6->stream).avail_in = (uInt)local_68.s;
      (pzVar6->stream).total_in = 0;
      (pzVar6->stream).next_out = local_88;
      (pzVar6->stream).avail_out = (uInt)paVar27;
      (pzVar6->stream).total_out = 0;
      uVar12 = cm_zlib_inflate(&pzVar6->stream,0);
      if (1 < uVar12) {
        if (uVar12 == 0xfffffffc) {
          archive_set_error(&a->archive,0xc,"Out of memory for ZIP decompression");
        }
        else {
          archive_set_error(&a->archive,-1,"ZIP decompression failed (%d)",(ulong)uVar12);
        }
        wVar11 = L'\xffffffe2';
        goto LAB_0035d026;
      }
      request = (archive_rb_node *)(pzVar6->stream).total_in;
      uVar7 = (pzVar6->stream).total_out;
      paVar27 = (archive_rb_node *)((long)paVar27 - uVar7);
      local_88 = local_88 + uVar7;
      paVar14 = local_40;
    }
    else if (*(char *)(paVar14[5].rb_nodes + 1) == '\0') {
      if (paVar27 < local_68.s) {
        local_68.s = (char *)paVar27;
      }
      memcpy(local_88,__src,(size_t)local_68.s);
      local_88 = local_88 + (long)local_68.s;
      paVar27 = (archive_rb_node *)((long)paVar27 - (long)local_68.s);
      uVar12 = (uint)(paVar27 == (archive_rb_node *)0x0);
      request = (archive_rb_node *)local_68.s;
    }
    else {
      uVar12 = 0;
      request = (archive_rb_node *)0x0;
    }
    __archive_read_consume(a,(int64_t)request);
    paVar28 = (archive_rb_node *)((long)paVar28 - (long)request);
  } while( true );
LAB_0035c851:
  __archive_read_consume(a,lVar22);
  goto LAB_0035c772;
switchD_0035c7d3_default:
  bVar26 = true;
  piVar20 = piVar15;
  lVar19 = lVar22 + 3;
  bVar8 = false;
  if (cVar1 != 'P') {
    if (cVar1 == 'K') {
      lVar19 = lVar22 + 2;
    }
    else {
switchD_0035c7d3_caseD_3:
      lVar19 = lVar22 + 4;
    }
LAB_0035c840:
    bVar26 = true;
    piVar20 = piVar15;
    bVar8 = false;
  }
  goto LAB_0035c7a4;
}

Assistant:

static int
archive_read_format_zip_seekable_read_header(struct archive_read *a,
	struct archive_entry *entry)
{
	struct zip *zip = (struct zip *)a->format->data;
	struct zip_entry *rsrc;
	int64_t offset;
	int r, ret = ARCHIVE_OK;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries ==
			ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW)
		zip->has_encrypted_entries = 0;

	a->archive.archive_format = ARCHIVE_FORMAT_ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "ZIP";

	if (zip->zip_entries == NULL) {
		r = slurp_central_directory(a, zip);
		if (r != ARCHIVE_OK)
			return r;
		/* Get first entry whose local header offset is lower than
		 * other entries in the archive file. */
		zip->entry =
		    (struct zip_entry *)ARCHIVE_RB_TREE_MIN(&zip->tree);
	} else if (zip->entry != NULL) {
		/* Get next entry in local header offset order. */
		zip->entry = (struct zip_entry *)__archive_rb_tree_iterate(
		    &zip->tree, &zip->entry->node, ARCHIVE_RB_DIR_RIGHT);
	}

	if (zip->entry == NULL)
		return ARCHIVE_EOF;

	if (zip->entry->rsrcname.s)
		rsrc = (struct zip_entry *)__archive_rb_tree_find_node(
		    &zip->tree_rsrc, zip->entry->rsrcname.s);
	else
		rsrc = NULL;

	if (zip->cctx_valid)
		archive_decrypto_aes_ctr_release(&zip->cctx);
	if (zip->hctx_valid)
		archive_hmac_sha1_cleanup(&zip->hctx);
	zip->tctx_valid = zip->cctx_valid = zip->hctx_valid = 0;
	__archive_read_reset_passphrase(a);

	/* File entries are sorted by the header offset, we should mostly
	 * use __archive_read_consume to advance a read point to avoid redundant
	 * data reading.  */
	offset = archive_filter_bytes(&a->archive, 0);
	if (offset < zip->entry->local_header_offset)
		__archive_read_consume(a,
		    zip->entry->local_header_offset - offset);
	else if (offset != zip->entry->local_header_offset) {
		__archive_read_seek(a, zip->entry->local_header_offset,
		    SEEK_SET);
	}
	zip->unconsumed = 0;
	r = zip_read_local_file_header(a, entry, zip);
	if (r != ARCHIVE_OK)
		return r;
	if (rsrc) {
		int ret2 = zip_read_mac_metadata(a, entry, rsrc);
		if (ret2 < ret)
			ret = ret2;
	}
	return (ret);
}